

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_GetIterator(JSContext *ctx,JSValue obj,BOOL is_async)

{
  int iVar1;
  JSValue *pJVar2;
  ulong uVar3;
  JSRefCountHeader *p;
  JSValue JVar4;
  JSValue JVar5;
  JSValue v;
  int local_38;
  
  if (is_async == 0) {
    JVar4 = JS_GetPropertyInternal(ctx,obj,0xc6,obj,0);
  }
  else {
    JVar4 = JS_GetPropertyInternal(ctx,obj,0xd1,obj,0);
    if ((int)JVar4.tag - 2U < 2) {
      JVar4 = JS_GetPropertyInternal(ctx,obj,0xc6,obj,0);
      if ((int)JVar4.tag == 6) {
        return JVar4;
      }
      JVar5 = JS_GetIterator2(ctx,obj,JVar4);
      JS_FreeValue(ctx,JVar4);
      if ((uint)JVar5.tag == 6) {
        return JVar5;
      }
      JVar4 = JS_GetPropertyInternal(ctx,JVar5,0x6a,JVar5,0);
      if ((int)JVar4.tag == 6) {
        v = (JSValue)(ZEXT816(6) << 0x40);
        uVar3 = 0;
      }
      else {
        v = JS_NewObjectClass(ctx,0x30);
        if ((v.tag & 0xffffffffU) == 6) {
          JS_FreeValue(ctx,JVar4);
        }
        else {
          pJVar2 = (JSValue *)js_mallocz(ctx,0x20);
          if (pJVar2 == (JSValue *)0x0) {
            JS_FreeValue(ctx,v);
            JS_FreeValue(ctx,JVar4);
            uVar3 = 0;
            v = (JSValue)(ZEXT816(6) << 0x40);
            goto LAB_00133173;
          }
          if (0xfffffff4 < (uint)JVar5.tag) {
            *(int *)JVar5.u.ptr = *JVar5.u.ptr + 1;
          }
          *pJVar2 = JVar5;
          pJVar2[1] = JVar4;
          local_38 = (int)v.tag;
          if (local_38 == -1) {
            *(JSValue **)((long)v.u.ptr + 0x30) = pJVar2;
          }
        }
        uVar3 = (ulong)v.u.ptr & 0xffffffff00000000;
      }
LAB_00133173:
      JVar4.tag = v.tag;
      JVar4.u.ptr = (void *)(v.u._0_4_ | uVar3);
      JS_FreeValue(ctx,JVar5);
      return JVar4;
    }
  }
  JVar5 = JVar4;
  if ((int)JVar4.tag != 6) {
    iVar1 = JS_IsFunction(ctx,JVar4);
    if (iVar1 == 0) {
      JS_FreeValue(ctx,JVar4);
      JS_ThrowTypeError(ctx,"value is not iterable");
      JVar5 = (JSValue)(ZEXT816(6) << 0x40);
    }
    else {
      JVar5 = JS_GetIterator2(ctx,obj,JVar4);
      JS_FreeValue(ctx,JVar4);
    }
  }
  return JVar5;
}

Assistant:

static JSValue JS_GetIterator(JSContext *ctx, JSValueConst obj, BOOL is_async)
{
    JSValue method, ret, sync_iter;

    if (is_async) {
        method = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_asyncIterator);
        if (JS_IsException(method))
            return method;
        if (JS_IsUndefined(method) || JS_IsNull(method)) {
            method = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_iterator);
            if (JS_IsException(method))
                return method;
            sync_iter = JS_GetIterator2(ctx, obj, method);
            JS_FreeValue(ctx, method);
            if (JS_IsException(sync_iter))
                return sync_iter;
            ret = JS_CreateAsyncFromSyncIterator(ctx, sync_iter);
            JS_FreeValue(ctx, sync_iter);
            return ret;
        }
    } else {
        method = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_iterator);
        if (JS_IsException(method))
            return method;
    }
    if (!JS_IsFunction(ctx, method)) {
        JS_FreeValue(ctx, method);
        return JS_ThrowTypeError(ctx, "value is not iterable");
    }
    ret = JS_GetIterator2(ctx, obj, method);
    JS_FreeValue(ctx, method);
    return ret;
}